

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_tests.cpp
# Opt level: O2

void __thiscall serialize_tests::compactsize::test_method(compactsize *this)

{
  iterator in_R8;
  iterator pvVar1;
  iterator in_R9;
  iterator pvVar2;
  ulong nSize;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string msg;
  const_string msg_00;
  check_type cVar3;
  char *local_168;
  char *local_160;
  undefined1 *local_158;
  undefined1 *local_150;
  char *local_148;
  char *local_140;
  char *local_138;
  char *local_130;
  size_type local_128;
  undefined **local_120;
  undefined1 local_118;
  undefined1 *local_110;
  char *local_108;
  undefined **local_100;
  undefined1 local_f8;
  undefined ***local_f0;
  size_type *local_e8;
  undefined **local_e0;
  undefined1 local_d8;
  undefined ***local_d0;
  char *local_c8;
  lazy_ostream local_c0;
  undefined ***local_b0;
  size_type *local_a8;
  assertion_result local_a0;
  undefined1 *local_88;
  undefined1 *local_80;
  char *local_78;
  char *local_70;
  size_type j;
  ulong local_60;
  DataStream local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58.m_read_pos = 0;
  local_58.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  for (nSize = 1; nSize < 0x2000001; nSize = nSize * 2) {
    WriteCompactSize<DataStream>(&local_58,nSize - 1);
    WriteCompactSize<DataStream>(&local_58,nSize);
  }
  for (local_60 = 1; local_60 < 0x2000001; local_60 = local_60 * 2) {
    j = ReadCompactSize<DataStream>(&local_58,true);
    local_78 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serialize_tests.cpp"
    ;
    local_70 = "";
    local_88 = &boost::unit_test::basic_cstring<char_const>::null;
    local_80 = &boost::unit_test::basic_cstring<char_const>::null;
    file.m_end = (iterator)0xaa;
    file.m_begin = (iterator)&local_78;
    msg.m_end = in_R9;
    msg.m_begin = in_R8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_88,msg);
    local_128 = local_60 - 1;
    local_a0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(local_128 == j);
    local_a0.m_message.px = (element_type *)0x0;
    local_a0.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_118 = 0;
    local_120 = &PTR__lazy_ostream_0114c730;
    local_110 = boost::unit_test::lazy_ostream::inst;
    local_108 = "decoded:";
    local_f8 = 0;
    local_100 = &PTR__lazy_ostream_0114c8f0;
    local_f0 = &local_120;
    local_e8 = &j;
    local_d8 = 0;
    local_e0 = &PTR__lazy_ostream_0114c930;
    local_d0 = &local_100;
    local_c8 = " expected:";
    local_c0.m_empty = false;
    local_c0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0114c970;
    local_b0 = &local_e0;
    local_a8 = &local_128;
    local_138 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serialize_tests.cpp"
    ;
    local_130 = "";
    pvVar1 = &DAT_00000001;
    pvVar2 = &DAT_00000001;
    boost::test_tools::tt_detail::report_assertion
              (&local_a0,&local_c0,1,1,WARN,_cVar3,(size_t)&local_138,0xaa);
    boost::detail::shared_count::~shared_count(&local_a0.m_message.pn);
    j = ReadCompactSize<DataStream>(&local_58,true);
    local_148 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serialize_tests.cpp"
    ;
    local_140 = "";
    local_158 = &boost::unit_test::basic_cstring<char_const>::null;
    local_150 = &boost::unit_test::basic_cstring<char_const>::null;
    file_00.m_end = (iterator)0xac;
    file_00.m_begin = (iterator)&local_148;
    msg_00.m_end = pvVar2;
    msg_00.m_begin = pvVar1;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_158,
               msg_00);
    local_a0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(local_60 == j);
    local_a0.m_message.px = (element_type *)0x0;
    local_a0.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_118 = 0;
    local_120 = &PTR__lazy_ostream_0114c730;
    local_110 = boost::unit_test::lazy_ostream::inst;
    local_108 = "decoded:";
    local_f8 = 0;
    local_100 = &PTR__lazy_ostream_0114c8f0;
    local_f0 = &local_120;
    local_e8 = &j;
    local_d8 = 0;
    local_e0 = &PTR__lazy_ostream_0114c930;
    local_d0 = &local_100;
    local_c8 = " expected:";
    local_c0.m_empty = false;
    local_c0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0114c970;
    local_b0 = &local_e0;
    local_a8 = &local_60;
    local_168 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serialize_tests.cpp"
    ;
    local_160 = "";
    in_R8 = &DAT_00000001;
    in_R9 = &DAT_00000001;
    boost::test_tools::tt_detail::report_assertion
              (&local_a0,&local_c0,1,1,WARN,_cVar3,(size_t)&local_168,0xac);
    boost::detail::shared_count::~shared_count(&local_a0.m_message.pn);
  }
  std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
            ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(compactsize)
{
    DataStream ss{};
    std::vector<char>::size_type i, j;

    for (i = 1; i <= MAX_SIZE; i *= 2)
    {
        WriteCompactSize(ss, i-1);
        WriteCompactSize(ss, i);
    }
    for (i = 1; i <= MAX_SIZE; i *= 2)
    {
        j = ReadCompactSize(ss);
        BOOST_CHECK_MESSAGE((i-1) == j, "decoded:" << j << " expected:" << (i-1));
        j = ReadCompactSize(ss);
        BOOST_CHECK_MESSAGE(i == j, "decoded:" << j << " expected:" << i);
    }
}